

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataCommands.cpp
# Opt level: O0

void __thiscall
DataCommands::DataCommands
          (DataCommands *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *separated)

{
  DataVars *this_00;
  DataBinds *this_01;
  OpenDataServerCommand *this_02;
  ConnectCommand *this_03;
  VarCommand *this_04;
  BindCommand *this_05;
  WhileCommand *this_06;
  IfCommand *this_07;
  PrintCommand *this_08;
  EqualCommand *this_09;
  EntercCommand *this_10;
  SleepCommand *this_11;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_Command_*>_&&>::value,_pair<iterator,_bool>_>
  _Var1;
  SleepCommand *local_2a8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>
  local_2a0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>,_true>
  local_278;
  undefined1 local_270;
  EntercCommand *local_268;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>
  local_260;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>,_true>
  local_238;
  undefined1 local_230;
  EqualCommand *local_228;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>
  local_220;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>,_true>
  local_1f8;
  undefined1 local_1f0;
  PrintCommand *local_1e8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>
  local_1e0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>,_true>
  local_1b8;
  undefined1 local_1b0;
  IfCommand *local_1a8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>
  local_1a0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>,_true>
  local_178;
  undefined1 local_170;
  WhileCommand *local_168;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>
  local_160;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>,_true>
  local_138;
  undefined1 local_130;
  BindCommand *local_128;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>
  local_120;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>,_true>
  local_f8;
  undefined1 local_f0;
  VarCommand *local_e8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>
  local_e0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>,_true>
  local_b8;
  undefined1 local_b0;
  ConnectCommand *local_a8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>
  local_a0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>,_true>
  local_78;
  undefined1 local_70;
  OpenDataServerCommand *local_68;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>
  local_60;
  DataBinds *local_38;
  DataBinds *dataBinds;
  DataVars *dataVars;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_18;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *separated_local;
  DataCommands *this_local;
  
  local_18 = separated;
  separated_local = &this->separated;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->separated);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>_>_>
  ::unordered_map(&this->stringsToCommands);
  this->index = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->separated,local_18);
  this_00 = (DataVars *)operator_new(0x58);
  DataVars::DataVars(this_00);
  dataBinds = (DataBinds *)this_00;
  this_01 = (DataBinds *)operator_new(0x38);
  DataBinds::DataBinds(this_01);
  local_38 = this_01;
  pthread_mutex_init((pthread_mutex_t *)&this->mutex,(pthread_mutexattr_t *)0x0);
  this_02 = (OpenDataServerCommand *)operator_new(0x78);
  OpenDataServerCommand::OpenDataServerCommand
            (this_02,this,local_38,(DataVars *)dataBinds,&this->mutex);
  local_68 = this_02;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>::
  pair<const_char_(&)[15],_OpenDataServerCommand_*,_true>
            (&local_60,(char (*) [15])"openDataServer",&local_68);
  _Var1 = std::
          unordered_map<std::__cxx11::string,Command*,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Command*>>>
          ::insert<std::pair<std::__cxx11::string,Command*>>
                    ((unordered_map<std::__cxx11::string,Command*,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Command*>>>
                      *)&this->stringsToCommands,&local_60);
  local_78._M_cur =
       (__node_type *)
       _Var1.first.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>,_true>
       ._M_cur;
  local_70 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>::
  ~pair(&local_60);
  this_03 = (ConnectCommand *)operator_new(0x78);
  ConnectCommand::ConnectCommand(this_03,this,local_38,(DataVars *)dataBinds,&this->mutex);
  local_a8 = this_03;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>::
  pair<const_char_(&)[8],_ConnectCommand_*,_true>(&local_a0,(char (*) [8])"connect",&local_a8);
  _Var1 = std::
          unordered_map<std::__cxx11::string,Command*,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Command*>>>
          ::insert<std::pair<std::__cxx11::string,Command*>>
                    ((unordered_map<std::__cxx11::string,Command*,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Command*>>>
                      *)&this->stringsToCommands,&local_a0);
  local_b8._M_cur =
       (__node_type *)
       _Var1.first.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>,_true>
       ._M_cur;
  local_b0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>::
  ~pair(&local_a0);
  this_04 = (VarCommand *)operator_new(0x18);
  VarCommand::VarCommand(this_04,this,(DataVars *)dataBinds);
  local_e8 = this_04;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>::
  pair<const_char_(&)[4],_VarCommand_*,_true>(&local_e0,(char (*) [4])"var",&local_e8);
  _Var1 = std::
          unordered_map<std::__cxx11::string,Command*,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Command*>>>
          ::insert<std::pair<std::__cxx11::string,Command*>>
                    ((unordered_map<std::__cxx11::string,Command*,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Command*>>>
                      *)&this->stringsToCommands,&local_e0);
  local_f8._M_cur =
       (__node_type *)
       _Var1.first.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>,_true>
       ._M_cur;
  local_f0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>::
  ~pair(&local_e0);
  this_05 = (BindCommand *)operator_new(0x18);
  BindCommand::BindCommand(this_05,this,local_38);
  local_128 = this_05;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>::
  pair<const_char_(&)[5],_BindCommand_*,_true>(&local_120,(char (*) [5])"bind",&local_128);
  _Var1 = std::
          unordered_map<std::__cxx11::string,Command*,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Command*>>>
          ::insert<std::pair<std::__cxx11::string,Command*>>
                    ((unordered_map<std::__cxx11::string,Command*,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Command*>>>
                      *)&this->stringsToCommands,&local_120);
  local_138._M_cur =
       (__node_type *)
       _Var1.first.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>,_true>
       ._M_cur;
  local_130 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>::
  ~pair(&local_120);
  this_06 = (WhileCommand *)operator_new(0x30);
  WhileCommand::WhileCommand(this_06,this,(DataVars *)dataBinds);
  local_168 = this_06;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>::
  pair<const_char_(&)[6],_WhileCommand_*,_true>(&local_160,(char (*) [6])"while",&local_168);
  _Var1 = std::
          unordered_map<std::__cxx11::string,Command*,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Command*>>>
          ::insert<std::pair<std::__cxx11::string,Command*>>
                    ((unordered_map<std::__cxx11::string,Command*,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Command*>>>
                      *)&this->stringsToCommands,&local_160);
  local_178._M_cur =
       (__node_type *)
       _Var1.first.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>,_true>
       ._M_cur;
  local_170 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>::
  ~pair(&local_160);
  this_07 = (IfCommand *)operator_new(0x30);
  IfCommand::IfCommand(this_07,this,(DataVars *)dataBinds);
  local_1a8 = this_07;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>::
  pair<const_char_(&)[3],_IfCommand_*,_true>(&local_1a0,(char (*) [3])"if",&local_1a8);
  _Var1 = std::
          unordered_map<std::__cxx11::string,Command*,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Command*>>>
          ::insert<std::pair<std::__cxx11::string,Command*>>
                    ((unordered_map<std::__cxx11::string,Command*,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Command*>>>
                      *)&this->stringsToCommands,&local_1a0);
  local_1b8._M_cur =
       (__node_type *)
       _Var1.first.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>,_true>
       ._M_cur;
  local_1b0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>::
  ~pair(&local_1a0);
  this_08 = (PrintCommand *)operator_new(0x18);
  PrintCommand::PrintCommand(this_08,this,(DataVars *)dataBinds);
  local_1e8 = this_08;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>::
  pair<const_char_(&)[6],_PrintCommand_*,_true>(&local_1e0,(char (*) [6])"print",&local_1e8);
  _Var1 = std::
          unordered_map<std::__cxx11::string,Command*,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Command*>>>
          ::insert<std::pair<std::__cxx11::string,Command*>>
                    ((unordered_map<std::__cxx11::string,Command*,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Command*>>>
                      *)&this->stringsToCommands,&local_1e0);
  local_1f8._M_cur =
       (__node_type *)
       _Var1.first.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>,_true>
       ._M_cur;
  local_1f0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>::
  ~pair(&local_1e0);
  this_09 = (EqualCommand *)operator_new(0x18);
  EqualCommand::EqualCommand(this_09,this,(DataVars *)dataBinds);
  local_228 = this_09;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>::
  pair<const_char_(&)[2],_EqualCommand_*,_true>(&local_220,(char (*) [2])0x14b705,&local_228);
  _Var1 = std::
          unordered_map<std::__cxx11::string,Command*,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Command*>>>
          ::insert<std::pair<std::__cxx11::string,Command*>>
                    ((unordered_map<std::__cxx11::string,Command*,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Command*>>>
                      *)&this->stringsToCommands,&local_220);
  local_238._M_cur =
       (__node_type *)
       _Var1.first.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>,_true>
       ._M_cur;
  local_230 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>::
  ~pair(&local_220);
  this_10 = (EntercCommand *)operator_new(0x10);
  EntercCommand::EntercCommand(this_10,this);
  local_268 = this_10;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>::
  pair<const_char_(&)[7],_EntercCommand_*,_true>(&local_260,(char (*) [7])"enterc",&local_268);
  _Var1 = std::
          unordered_map<std::__cxx11::string,Command*,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Command*>>>
          ::insert<std::pair<std::__cxx11::string,Command*>>
                    ((unordered_map<std::__cxx11::string,Command*,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Command*>>>
                      *)&this->stringsToCommands,&local_260);
  local_278._M_cur =
       (__node_type *)
       _Var1.first.
       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>,_true>
       ._M_cur;
  local_270 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>::
  ~pair(&local_260);
  this_11 = (SleepCommand *)operator_new(0x18);
  SleepCommand::SleepCommand(this_11,this,(DataVars *)dataBinds);
  local_2a8 = this_11;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>::
  pair<const_char_(&)[6],_SleepCommand_*,_true>(&local_2a0,(char (*) [6])"sleep",&local_2a8);
  std::
  unordered_map<std::__cxx11::string,Command*,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Command*>>>
  ::insert<std::pair<std::__cxx11::string,Command*>>
            ((unordered_map<std::__cxx11::string,Command*,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Command*>>>
              *)&this->stringsToCommands,&local_2a0);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Command_*>::
  ~pair(&local_2a0);
  return;
}

Assistant:

DataCommands::DataCommands(vector<string> &separated) {
    this->index = 0;
    this->separated = separated;

    DataVars *dataVars;
    dataVars = new DataVars();

    DataBinds *dataBinds;
    dataBinds = new DataBinds();

    pthread_mutex_init(&this->mutex, nullptr);

    this->stringsToCommands.insert(
            pair<string, Command *>("openDataServer", new OpenDataServerCommand(this, dataBinds, dataVars, mutex)));
    this->stringsToCommands.insert(
            pair<string, Command *>("connect", new ConnectCommand(this, dataBinds, dataVars, mutex)));
    this->stringsToCommands.insert(pair<string, Command *>("var", new VarCommand(this, dataVars)));
    this->stringsToCommands.insert(pair<string, Command *>("bind", new BindCommand(this, dataBinds)));
    this->stringsToCommands.insert(pair<string, Command *>("while", new WhileCommand(this, dataVars)));
    this->stringsToCommands.insert(pair<string, Command *>("if", new IfCommand(this, dataVars)));
    this->stringsToCommands.insert(pair<string, Command *>("print", new PrintCommand(this, dataVars)));
    this->stringsToCommands.insert(pair<string, Command *>("=", new EqualCommand(this, dataVars)));
    this->stringsToCommands.insert(pair<string, Command *>("enterc", new EntercCommand(this)));
    this->stringsToCommands.insert(pair<string, Command *>("sleep", new SleepCommand(this, dataVars)));
}